

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O1

ngx_int_t ngx_parse_addr_port(ngx_pool_t *pool,ngx_addr_t *addr,u_char *text,size_t len)

{
  ngx_int_t nVar1;
  size_t sVar2;
  ngx_int_t nVar3;
  u_char *puVar4;
  u_char *text_00;
  
  nVar1 = ngx_parse_addr(pool,addr,text,len);
  if (nVar1 == -5) {
    if ((len == 0) || (*text != '[')) {
      sVar2 = len;
      puVar4 = text;
      if (0 < (long)len) {
        do {
          if (*puVar4 == ':') goto LAB_00119756;
          sVar2 = sVar2 - 1;
          puVar4 = puVar4 + 1;
        } while (sVar2 != 0);
      }
      puVar4 = (u_char *)0x0;
LAB_00119756:
      sVar2 = len;
      text_00 = text;
      if (puVar4 == (u_char *)0x0) {
        return -5;
      }
    }
    else {
      sVar2 = len;
      puVar4 = text;
      if (0 < (long)len) {
        do {
          if (*puVar4 == ']') goto LAB_00119707;
          sVar2 = sVar2 - 1;
          puVar4 = puVar4 + 1;
        } while (sVar2 != 0);
      }
      puVar4 = (u_char *)0x0;
LAB_00119707:
      if (puVar4 == text + (len - 1) || puVar4 == (u_char *)0x0) {
        return -5;
      }
      if (puVar4[1] != ':') {
        return -5;
      }
      puVar4 = puVar4 + 1;
      sVar2 = len - 2;
      text_00 = text + 1;
    }
    nVar3 = ngx_atoi(puVar4 + 1,(size_t)(text + (len - (long)(puVar4 + 1))));
    nVar1 = -5;
    if ((0xffffffffffff0000 < nVar3 - 0x10000U) &&
       (nVar1 = ngx_parse_addr(pool,addr,text_00,sVar2 + ~(ulong)(text + (len - (long)(puVar4 + 1)))
                              ), nVar1 == 0)) {
      if (addr->sockaddr->sa_family != 1) {
        *(ushort *)addr->sockaddr->sa_data = (ushort)nVar3 << 8 | (ushort)nVar3 >> 8;
      }
      nVar1 = 0;
    }
  }
  return nVar1;
}

Assistant:

ngx_int_t
ngx_parse_addr_port(ngx_pool_t *pool, ngx_addr_t *addr, u_char *text,
    size_t len)
{
    u_char     *p, *last;
    size_t      plen;
    ngx_int_t   rc, port;

    rc = ngx_parse_addr(pool, addr, text, len);

    if (rc != NGX_DECLINED) {
        return rc;
    }

    last = text + len;

#if (NGX_HAVE_INET6)
    if (len && text[0] == '[') {

        p = ngx_strlchr(text, last, ']');

        if (p == NULL || p == last - 1 || *++p != ':') {
            return NGX_DECLINED;
        }

        text++;
        len -= 2;

    } else
#endif

    {
        p = ngx_strlchr(text, last, ':');

        if (p == NULL) {
            return NGX_DECLINED;
        }
    }

    p++;
    plen = last - p;

    port = ngx_atoi(p, plen);

    if (port < 1 || port > 65535) {
        return NGX_DECLINED;
    }

    len -= plen + 1;

    rc = ngx_parse_addr(pool, addr, text, len);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_inet_set_port(addr->sockaddr, (in_port_t) port);

    return NGX_OK;
}